

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

bool __thiscall
soul::heart::Parser::parseTerminator
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  uint64_t uVar1;
  uint64_t trueBranch_00;
  bool bVar2;
  Expression *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Expression *value;
  CompileMessage local_178;
  char *local_140;
  pool_ptr<soul::heart::Block> local_138;
  undefined1 local_130 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> falseBranchArgs;
  Block *falseBranch;
  undefined1 local_e8 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> trueBranchArgs;
  Block *trueBranch;
  Type local_a0;
  Expression *local_88;
  Expression *condition;
  undefined1 local_68 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> destArgs;
  Block *dest;
  FunctionBuilder *builder_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"branch");
  if (bVar2) {
    destArgs.space[3] = (uint64_t)parseBlockNameAndFind(this,state);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_68,this
               ,state);
    expectSemicolon(this);
    uVar1 = destArgs.space[3];
    pool_ptr<soul::heart::Block>::pool_ptr((pool_ptr<soul::heart::Block> *)&condition);
    FunctionBuilder::addBranch
              (builder,(Block *)uVar1,(ArgListType *)local_68,
               (pool_ptr<soul::heart::Block> *)&condition);
    pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)&condition);
    this_local._7_1_ = true;
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::~ArrayWithPreallocation
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_68);
  }
  else {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"branch_if");
    if (bVar2) {
      Type::Type(&local_a0,bool_);
      pEVar3 = parseExpression(this,state,&local_a0);
      Type::~Type(&local_a0);
      local_88 = pEVar3;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x54ca0c);
      trueBranchArgs.space[3] = (uint64_t)parseBlockNameAndFind(this,state);
      parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8,
                 this,state);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x575e29);
      falseBranchArgs.space[3] = (uint64_t)parseBlockNameAndFind(this,state);
      parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_130,
                 this,state);
      expectSemicolon(this);
      pEVar3 = local_88;
      trueBranch_00 = trueBranchArgs.space[3];
      uVar1 = falseBranchArgs.space[3];
      pool_ptr<soul::heart::Block>::pool_ptr(&local_138);
      FunctionBuilder::addBranchIf
                (builder,pEVar3,(Block *)trueBranch_00,(ArgListType *)local_e8,(Block *)uVar1,
                 (ArgListType *)local_130,&local_138);
      pool_ptr<soul::heart::Block>::~pool_ptr(&local_138);
      this_local._7_1_ = true;
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::~ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_130);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::~ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8);
    }
    else {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"return");
      if (bVar2) {
        local_140 = ";";
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x54c9e0);
        if (bVar2) {
          bVar2 = Type::isValid(&state->function->returnType);
          if ((bVar2) && (bVar2 = Type::isVoid(&state->function->returnType), !bVar2)) {
            getTypeDescription_abi_cxx11_((string *)&value,this,&state->function->returnType);
            Errors::expectedExpressionOfType<std::__cxx11::string>(&local_178,(Errors *)&value,args)
            ;
            CodeLocation::throwError
                      (&(this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ).location,&local_178);
          }
          FunctionBuilder::addReturn(builder);
          this_local._7_1_ = true;
        }
        else {
          pEVar3 = parseExpression(this,state,&state->function->returnType);
          expectSemicolon(this);
          FunctionBuilder::addReturn(builder,pEVar3);
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool parseTerminator (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("branch"))
        {
            auto& dest = parseBlockNameAndFind (state);
            auto destArgs = parseOptionalBranchArgs<heart::Branch::ArgListType> (state);
            expectSemicolon();
            builder.addBranch (dest, std::move (destArgs), {});
            return true;
        }

        if (matchIf ("branch_if"))
        {
            auto& condition = parseExpression (state, PrimitiveType::bool_);
            expect (HEARTOperator::question);
            auto& trueBranch = parseBlockNameAndFind (state);
            auto trueBranchArgs = parseOptionalBranchArgs<heart::BranchIf::ArgListType> (state);
            expect (HEARTOperator::colon);
            auto& falseBranch = parseBlockNameAndFind (state);
            auto falseBranchArgs = parseOptionalBranchArgs<heart::BranchIf::ArgListType> (state);
            expectSemicolon();
            builder.addBranchIf (condition, trueBranch, std::move (trueBranchArgs), falseBranch, std::move (falseBranchArgs), {});
            return true;
        }

        if (matchIf ("return"))
        {
            if (matchIf (HEARTOperator::semicolon))
            {
                if (state.function.returnType.isValid() && (! state.function.returnType.isVoid()))
                    location.throwError (Errors::expectedExpressionOfType (getTypeDescription (state.function.returnType)));

                builder.addReturn();
                return true;
            }

            auto& value = parseExpression (state, state.function.returnType);
            expectSemicolon();
            builder.addReturn (value);
            return true;
        }

        return false;
    }